

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EllipsoidRecord2::Encode(EllipsoidRecord2 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>
            (stream,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>
            (stream,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui16Length);
  KDataStream::Write(stream,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui8Index);
  KDataStream::Write(stream,(this->super_EllipsoidRecord1).super_EnvironmentRecord.m_ui8Padding);
  (*(this->super_EllipsoidRecord1).m_CentLocation.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_EllipsoidRecord1).m_CentLocation,stream);
  (*(this->super_EllipsoidRecord1).m_Sigma.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_EllipsoidRecord1).m_Sigma,stream);
  (*(this->m_DDT).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DDT,stream);
  (*(this->super_EllipsoidRecord1).m_Ori.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_EllipsoidRecord1).m_Ori,stream);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void EllipsoidRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << KDIS_STREAM m_Sigma
           << KDIS_STREAM m_DDT
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_ui32Padding; // padding to 64 bit boundary.
}